

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditIconButton::onAnimationFinished(QLineEditIconButton *this)

{
  bool bVar1;
  QLineEditPrivate *pQVar2;
  QLineEditIconButton *in_RDI;
  QLineEditPrivate *le;
  bool in_stack_0000002f;
  QWidgetPrivate *in_stack_00000030;
  QLineEditIconButton *in_stack_fffffffffffffff0;
  
  bVar1 = shouldHideWithText(in_RDI);
  if (((bVar1) && (bVar1 = QWidget::isVisible((QWidget *)0x5d38ca), bVar1)) &&
     ((in_RDI->m_fadingOut & 1U) != 0)) {
    QWidget::hide((QWidget *)0x5d38e3);
    in_RDI->m_fadingOut = false;
    pQVar2 = lineEditPrivate(in_stack_fffffffffffffff0);
    if (pQVar2 != (QLineEditPrivate *)0x0) {
      QWidgetPrivate::updateGeometry_helper(in_stack_00000030,in_stack_0000002f);
    }
  }
  return;
}

Assistant:

void QLineEditIconButton::onAnimationFinished()
{
    if (shouldHideWithText() && isVisible() && m_fadingOut) {
        hide();
        m_fadingOut = false;

        // Invalidate previous geometry to take into account new size of side widgets
        if (auto le = lineEditPrivate())
            le->updateGeometry_helper(true);
    }
}